

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

size_t __thiscall jrtplib::RTCPCompoundPacketBuilder::SDESSource::NeededBytes(SDESSource *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar1 = this->totalitemsize + 1;
  uVar3 = (ulong)((uint)lVar1 & 3);
  lVar2 = (this->totalitemsize - uVar3) + 5;
  if (uVar3 == 0) {
    lVar2 = lVar1;
  }
  return lVar2 + 4;
}

Assistant:

size_t NeededBytes()
		{
			size_t x,r;
			x = totalitemsize + 1; // +1 for the 0 byte which terminates the item list
			r = x%sizeof(uint32_t);
			if (r != 0)
				x += (sizeof(uint32_t)-r); // make sure it ends on a 32 bit boundary
			x += sizeof(uint32_t); // for ssrc
			return x;
		}